

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O2

void __thiscall zmq::mechanism_t::peer_routing_id(mechanism_t *this,msg_t *msg_)

{
  int iVar1;
  void *__dest;
  int *piVar2;
  char *errmsg_;
  
  iVar1 = msg_t::init_size(msg_,(this->_routing_id)._size);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    errmsg_ = strerror(*piVar2);
    fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/mechanism.cpp"
            ,0x3a);
    fflush(_stderr);
    zmq_abort(errmsg_);
  }
  __dest = msg_t::data(msg_);
  memcpy(__dest,(this->_routing_id)._data,(this->_routing_id)._size);
  msg_t::set_flags(msg_,'@');
  return;
}

Assistant:

void zmq::mechanism_t::peer_routing_id (msg_t *msg_)
{
    const int rc = msg_->init_size (_routing_id.size ());
    errno_assert (rc == 0);
    memcpy (msg_->data (), _routing_id.data (), _routing_id.size ());
    msg_->set_flags (msg_t::routing_id);
}